

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O0

void __thiscall FlowInfo::xrefInlinedBranch(FlowInfo *this,PcodeOp *op)

{
  OpCode OVar1;
  JumpTable *pJVar2;
  JumpTable *jt;
  PcodeOp *op_local;
  FlowInfo *this_local;
  
  jt = (JumpTable *)op;
  op_local = (PcodeOp *)this;
  OVar1 = PcodeOp::code(op);
  if (OVar1 == CPUI_CALL) {
    setupCallSpecs(this,(PcodeOp *)jt,(FuncCallSpecs *)0x0);
  }
  else {
    OVar1 = PcodeOp::code((PcodeOp *)jt);
    if (OVar1 == CPUI_CALLIND) {
      setupCallindSpecs(this,(PcodeOp *)jt,true,(FuncCallSpecs *)0x0);
    }
    else {
      OVar1 = PcodeOp::code((PcodeOp *)jt);
      if ((OVar1 == CPUI_BRANCHIND) &&
         (pJVar2 = Funcdata::linkJumpTable(this->data,(PcodeOp *)jt), pJVar2 == (JumpTable *)0x0)) {
        std::vector<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                  (&this->tablelist,(value_type *)&jt);
      }
    }
  }
  return;
}

Assistant:

void FlowInfo::xrefInlinedBranch(PcodeOp *op)

{
  if (op->code() == CPUI_CALL)
    setupCallSpecs(op,(FuncCallSpecs *)0);
  else if (op->code() == CPUI_CALLIND)
    setupCallindSpecs(op,true,(FuncCallSpecs *)0);
  else if (op->code() == CPUI_BRANCHIND) {
    JumpTable *jt = data.linkJumpTable(op);
    if (jt == (JumpTable *)0)
      tablelist.push_back(op); // Didn't recover a jumptable
  }
}